

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void analyzeOneTable(Parse *pParse,Table *pTab,Index *pOnlyIdx,int iStatCur,int iMem,int iTab)

{
  ushort uVar1;
  ushort uVar2;
  sqlite3 *db;
  u8 *zString;
  Schema *pSVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Vdbe *p;
  void *p_00;
  CollSeq *zP4;
  int p2;
  int p2_00;
  int p3;
  int p2_01;
  int p1;
  Schema **ppSVar11;
  Op *pOVar12;
  int iVar13;
  uint p1_00;
  Index *pIdx;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  int local_a4;
  
  db = pParse->db;
  iVar13 = iMem + 9;
  iVar5 = pParse->nMem;
  if (pParse->nMem <= iVar13) {
    iVar5 = iVar13;
  }
  pParse->nMem = iVar5;
  p = sqlite3GetVdbe(pParse);
  if (((pTab != (Table *)0x0 && p != (Vdbe *)0x0) && (pTab->eTabType == '\0')) &&
     ((zString = (u8 *)pTab->zName, zString == (u8 *)0x0 ||
      (iVar5 = patternCompare((u8 *)"sqlite\\_%",zString,&likeInfoNorm,0x5c), iVar5 != 0)))) {
    if (pTab->pSchema == (Schema *)0x0) {
      iVar5 = -0x8000;
    }
    else {
      iVar5 = -1;
      ppSVar11 = &db->aDb->pSchema;
      do {
        iVar5 = iVar5 + 1;
        pSVar3 = *ppSVar11;
        ppSVar11 = ppSVar11 + 4;
      } while (pSVar3 != pTab->pSchema);
    }
    iVar6 = sqlite3AuthCheck(pParse,0x1c,(char *)zString,(char *)0x0,db->aDb[iVar5].zDbSName);
    if (iVar6 == 0) {
      p2 = iMem + 4;
      p2_00 = iMem + 6;
      p3 = iMem + 8;
      sqlite3TableLock(pParse,iVar5,pTab->tnum,'\0',pTab->zName);
      iVar6 = iTab + 2;
      if (iTab + 2 < pParse->nTab) {
        iVar6 = pParse->nTab;
      }
      pParse->nTab = iVar6;
      sqlite3OpenTable(pParse,iTab,iVar5,pTab,0x70);
      pcVar15 = pTab->zName;
      iVar6 = sqlite3VdbeAddOp3(p,0x75,0,p2_00,0);
      sqlite3VdbeChangeP4(p,iVar6,pcVar15,0);
      pIdx = pTab->pIndex;
      if (pIdx == (Index *)0x0) {
        bVar4 = true;
      }
      else {
        iVar6 = iMem + 1;
        p2_01 = iMem + 2;
        p1 = iTab + 1;
        bVar4 = true;
        do {
          if (pOnlyIdx == (Index *)0x0 || pIdx == pOnlyIdx) {
            if (pIdx->pPartIdxWhere == (Expr *)0x0) {
              bVar4 = false;
            }
            if (((pTab->tabFlags & 0x80) == 0) || ((*(ushort *)&pIdx->field_0x63 & 3) != 2)) {
              uVar1 = pIdx->nColumn;
              pcVar15 = pIdx->zName;
              uVar2 = uVar1;
              if ((pIdx->field_0x63 & 8) != 0) {
                uVar2 = pIdx->nKeyCol;
              }
            }
            else {
              uVar1 = pIdx->nKeyCol;
              pcVar15 = pTab->zName;
              uVar2 = uVar1;
            }
            iVar7 = sqlite3VdbeAddOp3(p,0x75,0,iMem + 7,0);
            sqlite3VdbeChangeP4(p,iVar7,pcVar15,0);
            iVar7 = iVar13 + (uint)uVar2 + -1;
            if (iVar7 < pParse->nMem) {
              iVar7 = pParse->nMem;
            }
            pParse->nMem = iVar7;
            sqlite3VdbeAddOp3(p,0x70,p1,pIdx->tnum,iVar5);
            sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
            sqlite3VdbeAddOp3(p,0x47,(uint)uVar1,p2_01,0);
            sqlite3VdbeAddOp3(p,0x47,(uint)pIdx->nKeyCol,iMem + 3,0);
            iVar7 = sqlite3VdbeAddOp3(p,0x24,p1,0,0);
            sqlite3VdbeAddOp3(p,0x62,p1,p2,1);
            sqlite3VdbeAddOp3(p,0x47,db->nAnalysisLimit,iMem + 5,0);
            sqlite3VdbeAddFunctionCall(pParse,0,p2_01,iVar6,4,&statInitFuncdef,0);
            sqlite3VdbeAddOp3(p,0x47,0,p2_01,0);
            local_a4 = p->nOp;
            if (1 < uVar2) {
              p1_00 = uVar2 - 1;
              iVar8 = pParse->nLabel + -1;
              pParse->nLabel = iVar8;
              p_00 = sqlite3DbMallocRawNN(db,(ulong)p1_00 << 2);
              if (p_00 != (void *)0x0) {
                sqlite3VdbeAddOp3(p,9,0,0,0);
                local_a4 = p->nOp;
                if (((p1_00 == 1) && (pIdx->nKeyCol == 1)) && (pIdx->onError != '\0')) {
                  sqlite3VdbeAddOp3(p,0x33,iVar13,iVar8,0);
                }
                uVar14 = 1;
                if (1 < (int)p1_00) {
                  uVar14 = (ulong)p1_00;
                }
                uVar16 = 0;
                do {
                  zP4 = sqlite3LocateCollSeq(pParse,pIdx->azColl[uVar16]);
                  iVar9 = (int)uVar16;
                  sqlite3VdbeAddOp3(p,0x47,iVar9,p2_01,0);
                  sqlite3VdbeAddOp3(p,0x5e,p1,iVar9,p2);
                  iVar9 = sqlite3VdbeAddOp3(p,0x34,p2,0,iVar13 + iVar9);
                  sqlite3VdbeChangeP4(p,iVar9,(char *)zP4,-2);
                  *(int *)((long)p_00 + uVar16 * 4) = iVar9;
                  if (0 < (long)p->nOp) {
                    p->aOp[(long)p->nOp + -1].p5 = 0x80;
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar14 != uVar16);
                sqlite3VdbeAddOp3(p,0x47,p1_00,p2_01,0);
                sqlite3VdbeAddOp3(p,9,0,iVar8,0);
                pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
                if (p->db->mallocFailed == '\0') {
                  pOVar12 = p->aOp + (long)local_a4 + -1;
                }
                pOVar12->p2 = p->nOp;
                uVar16 = 0;
                do {
                  pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
                  if (p->db->mallocFailed == '\0') {
                    pOVar12 = p->aOp + *(int *)((long)p_00 + uVar16 * 4);
                  }
                  pOVar12->p2 = p->nOp;
                  sqlite3VdbeAddOp3(p,0x5e,p1,(int)uVar16,iVar13 + (int)uVar16);
                  uVar16 = uVar16 + 1;
                } while (uVar14 != uVar16);
                sqlite3VdbeResolveLabel(p,iVar8);
                sqlite3DbFreeNN(db,p_00);
              }
              if (p_00 == (void *)0x0) goto LAB_001b5c47;
            }
            sqlite3VdbeAddFunctionCall(pParse,1,iVar6,p2,2,&statPushFuncdef,0);
            if (db->nAnalysisLimit == 0) {
              sqlite3VdbeAddOp3(p,0x27,p1,local_a4,0);
            }
            else {
              iVar8 = sqlite3VdbeAddOp3(p,0x32,p2,0,0);
              iVar9 = sqlite3VdbeAddOp3(p,0x10,p2,0,0);
              iVar10 = sqlite3VdbeAddOp3(p,0x18,p1,0,iVar13);
              if (p->db->mallocFailed == '\0') {
                pOVar12 = p->aOp;
                pOVar12[iVar10].p4type = -3;
                pOVar12[iVar10].p4.i = 1;
              }
              pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
              if (p->db->mallocFailed == '\0') {
                pOVar12 = p->aOp + iVar8;
              }
              pOVar12->p2 = p->nOp;
              sqlite3VdbeAddOp3(p,0x27,p1,local_a4,0);
              iVar8 = p->nOp;
              if (p->db->mallocFailed == '\0') {
                pOVar12 = p->aOp;
                pOVar12[iVar9].p2 = iVar8;
                pOVar12 = pOVar12 + iVar10;
              }
              else {
                pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
                DAT_0021b448 = iVar8;
              }
              pOVar12->p2 = iVar8;
            }
            sqlite3VdbeAddFunctionCall(pParse,0,iVar6,p3,1,&statGetFuncdef,0);
            iVar8 = sqlite3VdbeAddOp3(p,0x61,p2_00,3,p2);
            sqlite3VdbeChangeP4(p,iVar8,"BBB",0);
            sqlite3VdbeAddOp3(p,0x7f,iStatCur,iMem,0);
            sqlite3VdbeAddOp3(p,0x80,iStatCur,p2,iMem);
            iVar8 = p->nOp;
            if (0 < (long)iVar8) {
              p->aOp[(long)iVar8 + -1].p5 = 8;
            }
            pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (p->db->mallocFailed == '\0') {
              pOVar12 = p->aOp + iVar7;
            }
            pOVar12->p2 = iVar8;
          }
LAB_001b5c47:
          pIdx = pIdx->pNext;
        } while (pIdx != (Index *)0x0);
      }
      if ((pOnlyIdx == (Index *)0x0) && (bVar4)) {
        sqlite3VdbeAddOp3(p,0x62,iTab,p3,0);
        iVar13 = sqlite3VdbeAddOp3(p,0x11,p3,0,0);
        sqlite3VdbeAddOp3(p,0x4b,0,iMem + 7,0);
        iVar5 = sqlite3VdbeAddOp3(p,0x61,p2_00,3,p2);
        sqlite3VdbeChangeP4(p,iVar5,"BBB",0);
        sqlite3VdbeAddOp3(p,0x7f,iStatCur,iMem,0);
        sqlite3VdbeAddOp3(p,0x80,iStatCur,p2,iMem);
        iVar5 = p->nOp;
        if (0 < (long)iVar5) {
          p->aOp[(long)iVar5 + -1].p5 = 8;
        }
        if (p->db->mallocFailed == '\0') {
          pOVar12 = p->aOp + iVar13;
        }
        else {
          pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar12->p2 = iVar5;
      }
    }
  }
  return;
}

Assistant:

static void analyzeOneTable(
  Parse *pParse,   /* Parser context */
  Table *pTab,     /* Table whose indices are to be analyzed */
  Index *pOnlyIdx, /* If not NULL, only analyze this one index */
  int iStatCur,    /* Index of VdbeCursor that writes the sqlite_stat1 table */
  int iMem,        /* Available memory locations begin here */
  int iTab         /* Next available cursor */
){
  sqlite3 *db = pParse->db;    /* Database handle */
  Index *pIdx;                 /* An index to being analyzed */
  int iIdxCur;                 /* Cursor open on index being analyzed */
  int iTabCur;                 /* Table cursor */
  Vdbe *v;                     /* The virtual machine being built up */
  int i;                       /* Loop counter */
  int jZeroRows = -1;          /* Jump from here if number of rows is zero */
  int iDb;                     /* Index of database containing pTab */
  u8 needTableCnt = 1;         /* True to count the table */
  int regNewRowid = iMem++;    /* Rowid for the inserted record */
  int regStat = iMem++;        /* Register to hold StatAccum object */
  int regChng = iMem++;        /* Index of changed index field */
  int regRowid = iMem++;       /* Rowid argument passed to stat_push() */
  int regTemp = iMem++;        /* Temporary use register */
  int regTemp2 = iMem++;       /* Second temporary use register */
  int regTabname = iMem++;     /* Register containing table name */
  int regIdxname = iMem++;     /* Register containing index name */
  int regStat1 = iMem++;       /* Value for the stat column of sqlite_stat1 */
  int regPrev = iMem;          /* MUST BE LAST (see below) */
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
  Table *pStat1 = 0;
#endif

  pParse->nMem = MAX(pParse->nMem, iMem);
  v = sqlite3GetVdbe(pParse);
  if( v==0 || NEVER(pTab==0) ){
    return;
  }
  if( !IsOrdinaryTable(pTab) ){
    /* Do not gather statistics on views or virtual tables */
    return;
  }
  if( sqlite3_strlike("sqlite\\_%", pTab->zName, '\\')==0 ){
    /* Do not gather statistics on system tables */
    return;
  }
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 );
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_ANALYZE, pTab->zName, 0,
      db->aDb[iDb].zDbSName ) ){
    return;
  }
#endif

#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
  if( db->xPreUpdateCallback ){
    pStat1 = (Table*)sqlite3DbMallocZero(db, sizeof(Table) + 13);
    if( pStat1==0 ) return;
    pStat1->zName = (char*)&pStat1[1];
    memcpy(pStat1->zName, "sqlite_stat1", 13);
    pStat1->nCol = 3;
    pStat1->iPKey = -1;
    sqlite3VdbeAddOp4(pParse->pVdbe, OP_Noop, 0, 0, 0,(char*)pStat1,P4_DYNAMIC);
  }
#endif

  /* Establish a read-lock on the table at the shared-cache level.
  ** Open a read-only cursor on the table. Also allocate a cursor number
  ** to use for scanning indexes (iIdxCur). No index cursor is opened at
  ** this time though.  */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);
  iTabCur = iTab++;
  iIdxCur = iTab++;
  pParse->nTab = MAX(pParse->nTab, iTab);
  sqlite3OpenTable(pParse, iTabCur, iDb, pTab, OP_OpenRead);
  sqlite3VdbeLoadString(v, regTabname, pTab->zName);

  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    int nCol;                     /* Number of columns in pIdx. "N" */
    int addrRewind;               /* Address of "OP_Rewind iIdxCur" */
    int addrNextRow;              /* Address of "next_row:" */
    const char *zIdxName;         /* Name of the index */
    int nColTest;                 /* Number of columns to test for changes */

    if( pOnlyIdx && pOnlyIdx!=pIdx ) continue;
    if( pIdx->pPartIdxWhere==0 ) needTableCnt = 0;
    if( !HasRowid(pTab) && IsPrimaryKeyIndex(pIdx) ){
      nCol = pIdx->nKeyCol;
      zIdxName = pTab->zName;
      nColTest = nCol - 1;
    }else{
      nCol = pIdx->nColumn;
      zIdxName = pIdx->zName;
      nColTest = pIdx->uniqNotNull ? pIdx->nKeyCol-1 : nCol-1;
    }

    /* Populate the register containing the index name. */
    sqlite3VdbeLoadString(v, regIdxname, zIdxName);
    VdbeComment((v, "Analysis for %s.%s", pTab->zName, zIdxName));

    /*
    ** Pseudo-code for loop that calls stat_push():
    **
    **   Rewind csr
    **   if eof(csr) goto end_of_scan;
    **   regChng = 0
    **   goto chng_addr_0;
    **
    **  next_row:
    **   regChng = 0
    **   if( idx(0) != regPrev(0) ) goto chng_addr_0
    **   regChng = 1
    **   if( idx(1) != regPrev(1) ) goto chng_addr_1
    **   ...
    **   regChng = N
    **   goto chng_addr_N
    **
    **  chng_addr_0:
    **   regPrev(0) = idx(0)
    **  chng_addr_1:
    **   regPrev(1) = idx(1)
    **  ...
    **
    **  endDistinctTest:
    **   regRowid = idx(rowid)
    **   stat_push(P, regChng, regRowid)
    **   Next csr
    **   if !eof(csr) goto next_row;
    **
    **  end_of_scan:
    */

    /* Make sure there are enough memory cells allocated to accommodate
    ** the regPrev array and a trailing rowid (the rowid slot is required
    ** when building a record to insert into the sample column of
    ** the sqlite_stat4 table.  */
    pParse->nMem = MAX(pParse->nMem, regPrev+nColTest);

    /* Open a read-only cursor on the index being analyzed. */
    assert( iDb==sqlite3SchemaToIndex(db, pIdx->pSchema) );
    sqlite3VdbeAddOp3(v, OP_OpenRead, iIdxCur, pIdx->tnum, iDb);
    sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
    VdbeComment((v, "%s", pIdx->zName));

    /* Invoke the stat_init() function. The arguments are:
    **
    **    (1) the number of columns in the index including the rowid
    **        (or for a WITHOUT ROWID table, the number of PK columns),
    **    (2) the number of columns in the key without the rowid/pk
    **    (3) estimated number of rows in the index,
    */
    sqlite3VdbeAddOp2(v, OP_Integer, nCol, regStat+1);
    assert( regRowid==regStat+2 );
    sqlite3VdbeAddOp2(v, OP_Integer, pIdx->nKeyCol, regRowid);
#ifdef SQLITE_ENABLE_STAT4
    if( OptimizationEnabled(db, SQLITE_Stat4) ){
      sqlite3VdbeAddOp2(v, OP_Count, iIdxCur, regTemp);
      addrRewind = sqlite3VdbeAddOp1(v, OP_Rewind, iIdxCur);
      VdbeCoverage(v);
    }else
#endif
    {
      addrRewind = sqlite3VdbeAddOp1(v, OP_Rewind, iIdxCur);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Count, iIdxCur, regTemp, 1);
    }
    assert( regTemp2==regStat+4 );
    sqlite3VdbeAddOp2(v, OP_Integer, db->nAnalysisLimit, regTemp2);
    sqlite3VdbeAddFunctionCall(pParse, 0, regStat+1, regStat, 4,
                               &statInitFuncdef, 0);

    /* Implementation of the following:
    **
    **   Rewind csr
    **   if eof(csr) goto end_of_scan;
    **   regChng = 0
    **   goto next_push_0;
    **
    */
    sqlite3VdbeAddOp2(v, OP_Integer, 0, regChng);
    addrNextRow = sqlite3VdbeCurrentAddr(v);

    if( nColTest>0 ){
      int endDistinctTest = sqlite3VdbeMakeLabel(pParse);
      int *aGotoChng;               /* Array of jump instruction addresses */
      aGotoChng = sqlite3DbMallocRawNN(db, sizeof(int)*nColTest);
      if( aGotoChng==0 ) continue;

      /*
      **  next_row:
      **   regChng = 0
      **   if( idx(0) != regPrev(0) ) goto chng_addr_0
      **   regChng = 1
      **   if( idx(1) != regPrev(1) ) goto chng_addr_1
      **   ...
      **   regChng = N
      **   goto endDistinctTest
      */
      sqlite3VdbeAddOp0(v, OP_Goto);
      addrNextRow = sqlite3VdbeCurrentAddr(v);
      if( nColTest==1 && pIdx->nKeyCol==1 && IsUniqueIndex(pIdx) ){
        /* For a single-column UNIQUE index, once we have found a non-NULL
        ** row, we know that all the rest will be distinct, so skip
        ** subsequent distinctness tests. */
        sqlite3VdbeAddOp2(v, OP_NotNull, regPrev, endDistinctTest);
        VdbeCoverage(v);
      }
      for(i=0; i<nColTest; i++){
        char *pColl = (char*)sqlite3LocateCollSeq(pParse, pIdx->azColl[i]);
        sqlite3VdbeAddOp2(v, OP_Integer, i, regChng);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, i, regTemp);
        analyzeVdbeCommentIndexWithColumnName(v,pIdx,i);
        aGotoChng[i] =
        sqlite3VdbeAddOp4(v, OP_Ne, regTemp, 0, regPrev+i, pColl, P4_COLLSEQ);
        sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
        VdbeCoverage(v);
      }
      sqlite3VdbeAddOp2(v, OP_Integer, nColTest, regChng);
      sqlite3VdbeGoto(v, endDistinctTest);


      /*
      **  chng_addr_0:
      **   regPrev(0) = idx(0)
      **  chng_addr_1:
      **   regPrev(1) = idx(1)
      **  ...
      */
      sqlite3VdbeJumpHere(v, addrNextRow-1);
      for(i=0; i<nColTest; i++){
        sqlite3VdbeJumpHere(v, aGotoChng[i]);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, i, regPrev+i);
        analyzeVdbeCommentIndexWithColumnName(v,pIdx,i);
      }
      sqlite3VdbeResolveLabel(v, endDistinctTest);
      sqlite3DbFree(db, aGotoChng);
    }

    /*
    **  chng_addr_N:
    **   regRowid = idx(rowid)            // STAT4 only
    **   stat_push(P, regChng, regRowid)  // 3rd parameter STAT4 only
    **   Next csr
    **   if !eof(csr) goto next_row;
    */
#ifdef SQLITE_ENABLE_STAT4
    if( OptimizationEnabled(db, SQLITE_Stat4) ){
      assert( regRowid==(regStat+2) );
      if( HasRowid(pTab) ){
        sqlite3VdbeAddOp2(v, OP_IdxRowid, iIdxCur, regRowid);
      }else{
        Index *pPk = sqlite3PrimaryKeyIndex(pIdx->pTable);
        int j, k, regKey;
        regKey = sqlite3GetTempRange(pParse, pPk->nKeyCol);
        for(j=0; j<pPk->nKeyCol; j++){
          k = sqlite3TableColumnToIndex(pIdx, pPk->aiColumn[j]);
          assert( k>=0 && k<pIdx->nColumn );
          sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, k, regKey+j);
          analyzeVdbeCommentIndexWithColumnName(v,pIdx,k);
        }
        sqlite3VdbeAddOp3(v, OP_MakeRecord, regKey, pPk->nKeyCol, regRowid);
        sqlite3ReleaseTempRange(pParse, regKey, pPk->nKeyCol);
      }
    }
#endif
    assert( regChng==(regStat+1) );
    {
      sqlite3VdbeAddFunctionCall(pParse, 1, regStat, regTemp, 2+IsStat4,
                                 &statPushFuncdef, 0);
      if( db->nAnalysisLimit ){
        int j1, j2, j3;
        j1 = sqlite3VdbeAddOp1(v, OP_IsNull, regTemp); VdbeCoverage(v);
        j2 = sqlite3VdbeAddOp1(v, OP_If, regTemp); VdbeCoverage(v);
        j3 = sqlite3VdbeAddOp4Int(v, OP_SeekGT, iIdxCur, 0, regPrev, 1);
        VdbeCoverage(v);
        sqlite3VdbeJumpHere(v, j1);
        sqlite3VdbeAddOp2(v, OP_Next, iIdxCur, addrNextRow); VdbeCoverage(v);
        sqlite3VdbeJumpHere(v, j2);
        sqlite3VdbeJumpHere(v, j3);
      }else{
        sqlite3VdbeAddOp2(v, OP_Next, iIdxCur, addrNextRow); VdbeCoverage(v);
      }
    }

    /* Add the entry to the stat1 table. */
    callStatGet(pParse, regStat, STAT_GET_STAT1, regStat1);
    assert( "BBB"[0]==SQLITE_AFF_TEXT );
    sqlite3VdbeAddOp4(v, OP_MakeRecord, regTabname, 3, regTemp, "BBB", 0);
    sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur, regNewRowid);
    sqlite3VdbeAddOp3(v, OP_Insert, iStatCur, regTemp, regNewRowid);
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
    sqlite3VdbeChangeP4(v, -1, (char*)pStat1, P4_TABLE);
#endif
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);

    /* Add the entries to the stat4 table. */
#ifdef SQLITE_ENABLE_STAT4
    if( OptimizationEnabled(db, SQLITE_Stat4) && db->nAnalysisLimit==0 ){
      int regEq = regStat1;
      int regLt = regStat1+1;
      int regDLt = regStat1+2;
      int regSample = regStat1+3;
      int regCol = regStat1+4;
      int regSampleRowid = regCol + nCol;
      int addrNext;
      int addrIsNull;
      u8 seekOp = HasRowid(pTab) ? OP_NotExists : OP_NotFound;

      pParse->nMem = MAX(pParse->nMem, regCol+nCol);

      addrNext = sqlite3VdbeCurrentAddr(v);
      callStatGet(pParse, regStat, STAT_GET_ROWID, regSampleRowid);
      addrIsNull = sqlite3VdbeAddOp1(v, OP_IsNull, regSampleRowid);
      VdbeCoverage(v);
      callStatGet(pParse, regStat, STAT_GET_NEQ, regEq);
      callStatGet(pParse, regStat, STAT_GET_NLT, regLt);
      callStatGet(pParse, regStat, STAT_GET_NDLT, regDLt);
      sqlite3VdbeAddOp4Int(v, seekOp, iTabCur, addrNext, regSampleRowid, 0);
      VdbeCoverage(v);
      for(i=0; i<nCol; i++){
        sqlite3ExprCodeLoadIndexColumn(pParse, pIdx, iTabCur, i, regCol+i);
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regCol, nCol, regSample);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regTabname, 6, regTemp);
      sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur+1, regNewRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iStatCur+1, regTemp, regNewRowid);
      sqlite3VdbeAddOp2(v, OP_Goto, 1, addrNext); /* P1==1 for end-of-loop */
      sqlite3VdbeJumpHere(v, addrIsNull);
    }
#endif /* SQLITE_ENABLE_STAT4 */

    /* End of analysis */
    sqlite3VdbeJumpHere(v, addrRewind);
  }


  /* Create a single sqlite_stat1 entry containing NULL as the index
  ** name and the row count as the content.
  */
  if( pOnlyIdx==0 && needTableCnt ){
    VdbeComment((v, "%s", pTab->zName));
    sqlite3VdbeAddOp2(v, OP_Count, iTabCur, regStat1);
    jZeroRows = sqlite3VdbeAddOp1(v, OP_IfNot, regStat1); VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Null, 0, regIdxname);
    assert( "BBB"[0]==SQLITE_AFF_TEXT );
    sqlite3VdbeAddOp4(v, OP_MakeRecord, regTabname, 3, regTemp, "BBB", 0);
    sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur, regNewRowid);
    sqlite3VdbeAddOp3(v, OP_Insert, iStatCur, regTemp, regNewRowid);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
    sqlite3VdbeChangeP4(v, -1, (char*)pStat1, P4_TABLE);
#endif
    sqlite3VdbeJumpHere(v, jZeroRows);
  }
}